

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O2

void btPolyhedralContactClipping::clipFaceAgainstHull
               (btVector3 *separatingNormal,btConvexPolyhedron *hullA,btTransform *transA,
               btVertexArray *worldVertsB1,btScalar minDist,btScalar maxDist,Result *resultOut)

{
  btFace *pbVar1;
  int *piVar2;
  btVector3 *pbVar3;
  btVertexArray *pVtxIn;
  btAlignedObjectArray<btVector3> *this;
  btVector3 *v1;
  int i;
  long lVar4;
  int face;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  float fVar18;
  btVector3 bVar19;
  btVector3 Normal;
  btVector3 local_f0;
  btVector3 *local_e0;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  btVector3 WorldEdge0;
  btVector3 worldPlaneAnormal1;
  btVertexArray worldVertsB2;
  btVector3 local_40;
  
  this = &worldVertsB2;
  worldVertsB2.m_ownsMemory = true;
  worldVertsB2.m_data = (btVector3 *)0x0;
  worldVertsB2.m_size = 0;
  worldVertsB2.m_capacity = 0;
  local_e0 = separatingNormal;
  btAlignedObjectArray<btVector3>::reserve(this,worldVertsB1->m_size);
  uVar6 = 0xffffffffffffffff;
  uVar16 = 0;
  uVar17 = 0;
  lVar4 = 0x28;
  fVar12 = 3.4028235e+38;
  for (uVar5 = 0; (long)uVar5 < (long)(hullA->m_faces).m_size; uVar5 = uVar5 + 1) {
    pbVar1 = (hullA->m_faces).m_data;
    Normal.m_floats[1] = *(btScalar *)((long)pbVar1->m_plane + lVar4 + -0x24);
    Normal.m_floats[0] = *(btScalar *)((long)pbVar1->m_plane + lVar4 + -0x28);
    Normal.m_floats[2] = *(btScalar *)((long)pbVar1->m_plane + lVar4 + -0x20);
    Normal.m_floats[3] = 0.0;
    bVar19 = operator*(&transA->m_basis,&Normal);
    fVar13 = bVar19.m_floats[2] * local_e0->m_floats[2] +
             local_e0->m_floats[0] * bVar19.m_floats[0] + bVar19.m_floats[1] * local_e0->m_floats[1]
    ;
    if (fVar13 < fVar12) {
      uVar6 = uVar5;
    }
    uVar6 = uVar6 & 0xffffffff;
    if (fVar12 <= fVar13) {
      fVar13 = fVar12;
    }
    lVar4 = lVar4 + 0x30;
    fVar12 = fVar13;
  }
  if (-1 < (int)uVar6) {
    pbVar1 = (hullA->m_faces).m_data;
    uVar6 = uVar6 & 0xffffffff;
    uVar8 = pbVar1[uVar6].m_indices.m_size;
    uVar5 = 0;
    local_d8 = 0;
    if (0 < (int)uVar8) {
      local_d8 = (ulong)uVar8;
    }
    for (; pVtxIn = worldVertsB1, local_d8 != uVar5; uVar5 = uVar5 + 1) {
      piVar2 = pbVar1[uVar6].m_indices.m_data;
      pbVar3 = (hullA->m_vertices).m_data;
      v1 = pbVar3 + piVar2[uVar5];
      Normal = operator-(v1,pbVar3 + piVar2[(long)((int)uVar5 + 1) % (long)(int)uVar8 & 0xffffffff])
      ;
      WorldEdge0 = operator*(&transA->m_basis,&Normal);
      local_f0.m_floats[3] = 0.0;
      local_f0.m_floats._0_12_ = *(undefined1 (*) [12])pbVar1[uVar6].m_plane;
      worldPlaneAnormal1 = operator*(&transA->m_basis,&local_f0);
      bVar19 = btVector3::cross(&WorldEdge0,&worldPlaneAnormal1);
      uStack_b0 = extraout_XMM0_Qb;
      local_b8 = (undefined1  [8])bVar19.m_floats._0_8_;
      local_c8._8_4_ = uVar16;
      local_c8._0_8_ = bVar19.m_floats._8_8_;
      local_c8._12_4_ = uVar17;
      bVar19 = btTransform::operator()(transA,v1);
      local_f0.m_floats[1] = -(float)local_b8._4_4_;
      local_f0.m_floats[0] = -(float)local_b8._0_4_;
      local_f0.m_floats[2] = -(float)local_c8._0_4_;
      local_f0.m_floats[3] = 0.0;
      clipFace(pVtxIn,this,&local_f0,
               -((bVar19.m_floats[0] * -(float)local_b8._0_4_ +
                 bVar19.m_floats[1] * -(float)local_b8._4_4_) -
                bVar19.m_floats[2] * (float)local_c8._0_4_));
      btAlignedObjectArray<btVector3>::resize(pVtxIn,0,&local_40);
      worldVertsB1 = this;
      this = pVtxIn;
    }
    Normal.m_floats[3] = 0.0;
    Normal.m_floats._0_12_ = *(undefined1 (*) [12])pbVar1[uVar6].m_plane;
    fVar12 = pbVar1[uVar6].m_plane[3];
    bVar19 = operator*(&transA->m_basis,&Normal);
    fVar14 = bVar19.m_floats[2];
    fVar13 = bVar19.m_floats[0];
    fVar11 = bVar19.m_floats[1];
    fVar9 = fVar11 * (transA->m_origin).m_floats[1];
    fVar15 = (transA->m_origin).m_floats[0] * fVar13;
    fVar10 = fVar14 * (transA->m_origin).m_floats[2];
    lVar7 = 0;
    unique0x1000015c = (int)extraout_XMM0_Qb_00;
    local_b8 = (undefined1  [8])bVar19.m_floats._0_8_;
    unique0x10000160 = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    local_c8._8_4_ = uVar16;
    local_c8._0_8_ = bVar19.m_floats._8_8_;
    local_c8._12_4_ = uVar17;
    local_d8 = CONCAT44(fVar11,fVar11);
    fStack_d0 = fVar11;
    fStack_cc = fVar11;
    for (lVar4 = 0; lVar4 < pVtxIn->m_size; lVar4 = lVar4 + 1) {
      pbVar3 = pVtxIn->m_data;
      fVar18 = *(float *)((long)pbVar3->m_floats + lVar7 + 8) * fVar14 +
               *(float *)((long)pbVar3->m_floats + lVar7) * fVar13 +
               *(float *)((long)pbVar3->m_floats + lVar7 + 4) * fVar11 +
               (fVar12 - (fVar10 + fVar15 + fVar9));
      uVar8 = -(uint)(fVar18 <= minDist);
      if ((float)(uVar8 & (uint)minDist | ~uVar8 & (uint)fVar18) <= maxDist) {
        WorldEdge0.m_floats = *(btScalar (*) [4])((long)pbVar3->m_floats + lVar7);
        (*resultOut->_vptr_Result[4])(resultOut,local_e0,&WorldEdge0);
        fVar13 = (float)local_b8._0_4_;
        fVar14 = (float)local_c8._0_4_;
        fVar11 = (float)local_d8;
      }
      lVar7 = lVar7 + 0x10;
    }
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&worldVertsB2);
  return;
}

Assistant:

void	btPolyhedralContactClipping::clipFaceAgainstHull(const btVector3& separatingNormal, const btConvexPolyhedron& hullA,  const btTransform& transA, btVertexArray& worldVertsB1, const btScalar minDist, btScalar maxDist,btDiscreteCollisionDetectorInterface::Result& resultOut)
{
	btVertexArray worldVertsB2;
	btVertexArray* pVtxIn = &worldVertsB1;
	btVertexArray* pVtxOut = &worldVertsB2;
	pVtxOut->reserve(pVtxIn->size());

	int closestFaceA=-1;
	{
		btScalar dmin = FLT_MAX;
		for(int face=0;face<hullA.m_faces.size();face++)
		{
			const btVector3 Normal(hullA.m_faces[face].m_plane[0], hullA.m_faces[face].m_plane[1], hullA.m_faces[face].m_plane[2]);
			const btVector3 faceANormalWS = transA.getBasis() * Normal;
		
			btScalar d = faceANormalWS.dot(separatingNormal);
			if (d < dmin)
			{
				dmin = d;
				closestFaceA = face;
			}
		}
	}
	if (closestFaceA<0)
		return;

	const btFace& polyA = hullA.m_faces[closestFaceA];

		// clip polygon to back of planes of all faces of hull A that are adjacent to witness face
	int numVerticesA = polyA.m_indices.size();
	for(int e0=0;e0<numVerticesA;e0++)
	{
		const btVector3& a = hullA.m_vertices[polyA.m_indices[e0]];
		const btVector3& b = hullA.m_vertices[polyA.m_indices[(e0+1)%numVerticesA]];
		const btVector3 edge0 = a - b;
		const btVector3 WorldEdge0 = transA.getBasis() * edge0;
		btVector3 worldPlaneAnormal1 = transA.getBasis()* btVector3(polyA.m_plane[0],polyA.m_plane[1],polyA.m_plane[2]);

		btVector3 planeNormalWS1 = -WorldEdge0.cross(worldPlaneAnormal1);//.cross(WorldEdge0);
		btVector3 worldA1 = transA*a;
		btScalar planeEqWS1 = -worldA1.dot(planeNormalWS1);
		
//int otherFace=0;
#ifdef BLA1
		int otherFace = polyA.m_connectedFaces[e0];
		btVector3 localPlaneNormal (hullA.m_faces[otherFace].m_plane[0],hullA.m_faces[otherFace].m_plane[1],hullA.m_faces[otherFace].m_plane[2]);
		btScalar localPlaneEq = hullA.m_faces[otherFace].m_plane[3];

		btVector3 planeNormalWS = transA.getBasis()*localPlaneNormal;
		btScalar planeEqWS=localPlaneEq-planeNormalWS.dot(transA.getOrigin());
#else 
		btVector3 planeNormalWS = planeNormalWS1;
		btScalar planeEqWS=planeEqWS1;
		
#endif
		//clip face

		clipFace(*pVtxIn, *pVtxOut,planeNormalWS,planeEqWS);
		btSwap(pVtxIn,pVtxOut);
		pVtxOut->resize(0);
	}



//#define ONLY_REPORT_DEEPEST_POINT

	btVector3 point;
	

	// only keep points that are behind the witness face
	{
		btVector3 localPlaneNormal (polyA.m_plane[0],polyA.m_plane[1],polyA.m_plane[2]);
		btScalar localPlaneEq = polyA.m_plane[3];
		btVector3 planeNormalWS = transA.getBasis()*localPlaneNormal;
		btScalar planeEqWS=localPlaneEq-planeNormalWS.dot(transA.getOrigin());
		for (int i=0;i<pVtxIn->size();i++)
		{
			btVector3 vtx = pVtxIn->at(i);
			btScalar depth = planeNormalWS.dot(vtx)+planeEqWS;
			if (depth <=minDist)
			{
//				printf("clamped: depth=%f to minDist=%f\n",depth,minDist);
				depth = minDist;
			}

			if (depth <=maxDist)
			{
				btVector3 point = pVtxIn->at(i);
#ifdef ONLY_REPORT_DEEPEST_POINT
				curMaxDist = depth;
#else
#if 0
				if (depth<-3)
				{
					printf("error in btPolyhedralContactClipping depth = %f\n", depth);
					printf("likely wrong separatingNormal passed in\n");
				} 
#endif				
				resultOut.addContactPoint(separatingNormal,point,depth);
#endif
			}
		}
	}
#ifdef ONLY_REPORT_DEEPEST_POINT
	if (curMaxDist<maxDist)
	{
		resultOut.addContactPoint(separatingNormal,point,curMaxDist);
	}
#endif //ONLY_REPORT_DEEPEST_POINT

}